

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

string * __thiscall
qpdf::BaseHandle::unparse_abi_cxx11_(string *__return_storage_ptr__,BaseHandle *this)

{
  _Rb_tree_color _Var1;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var2;
  pointer pQVar3;
  bool bVar4;
  qpdf_object_type_e qVar5;
  variant_alternative_t<8UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar6;
  variant_alternative_t<9UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar7;
  _Base_ptr p_Var8;
  variant_alternative_t<4UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar9;
  variant_alternative_t<3UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar10;
  string *psVar11;
  variant_alternative_t<6UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *this_00;
  string *name;
  logic_error *this_01;
  char *__s;
  int j;
  int iVar12;
  pointer this_02;
  string local_d8;
  variant_alternative_t<8UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  qVar5 = resolved_type_code(this);
  switch(qVar5) {
  case ot_uninitialized:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_01,"QPDFObjectHandle: attempting to unparse an uninitialized object");
    goto LAB_00197911;
  case ot_reserved:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_01,"QPDFObjectHandle: attempting to unparse a reserved object");
    goto LAB_00197911;
  case ot_null:
    __s = "null";
    goto LAB_0019777d;
  case ot_boolean:
    pvVar10 = std::
              get<3ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    __s = "false";
    if (pvVar10->val != false) {
      __s = "true";
    }
LAB_0019777d:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_d8);
    break;
  case ot_integer:
    pvVar9 = std::
             get<4ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->value);
    std::__cxx11::to_string(__return_storage_ptr__,pvVar9->val);
    break;
  case ot_real:
    psVar11 = (string *)
              std::
              get<5ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    goto LAB_001977ac;
  case ot_string:
    this_00 = std::
              get<6ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    QPDF_String::unparse_abi_cxx11_(__return_storage_ptr__,this_00,false);
    break;
  case ot_name:
    name = &std::
            get<7ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                      (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->value)->name;
    Name::normalize(__return_storage_ptr__,name);
    break;
  case ot_array:
    pvVar6 = std::
             get<8ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[ ",(allocator<char> *)&local_d8);
    _Var2._M_head_impl =
         (pvVar6->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var2._M_head_impl == (Sparse *)0x0) {
      pQVar3 = (pvVar6->elements).
               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_02 = (pvVar6->elements).
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_start; this_02 != pQVar3; this_02 = this_02 + 1) {
        QPDFObjectHandle::unparse_abi_cxx11_(&local_b0,this_02);
        std::operator+(&local_d8,&local_b0," ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
    else {
      iVar12 = 0;
      local_b8 = pvVar6;
      for (p_Var8 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->elements + 0x18); pvVar6 = local_b8,
          (_Rb_tree_header *)p_Var8 !=
          (_Rb_tree_header *)((long)&(_Var2._M_head_impl)->elements + 8U);
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        _Var1 = p_Var8[1]._M_color;
        for (; iVar12 < (int)_Var1; iVar12 = iVar12 + 1) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        QPDFObjectHandle::unparse_abi_cxx11_(&local_b0,(QPDFObjectHandle *)&p_Var8[1]._M_parent);
        std::operator+(&local_d8,&local_b0," ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b0);
        iVar12 = _Var1 + _S_black;
      }
      for (; iVar12 < ((pvVar6->sp)._M_t.
                       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                       .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->size;
          iVar12 = iVar12 + 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case ot_dictionary:
    pvVar7 = std::
             get<9ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<< ",(allocator<char> *)&local_d8);
    for (p_Var8 = (pvVar7->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pvVar7->items)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      bVar4 = null((BaseHandle *)(p_Var8 + 2));
      if (!bVar4) {
        Name::normalize(&local_50,(string *)(p_Var8 + 1));
        std::operator+(&local_90,&local_50," ");
        QPDFObjectHandle::unparse_abi_cxx11_(&local_70,(QPDFObjectHandle *)(p_Var8 + 2));
        std::operator+(&local_b0,&local_90,&local_70);
        std::operator+(&local_d8,&local_b0," ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case ot_stream:
    QPDFObjGen::unparse_abi_cxx11_
              (&local_d8,
               &((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og,
               ' ');
    std::operator+(__return_storage_ptr__,&local_d8," R");
    goto LAB_0019755c;
  case ot_operator:
    psVar11 = (string *)
              std::
              get<11ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    goto LAB_001977ac;
  case ot_inlineimage:
    psVar11 = (string *)
              std::
              get<12ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
LAB_001977ac:
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar11);
    break;
  case ot_unresolved:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_01,"QPDFObjectHandle: attempting to unparse a unresolved object");
    goto LAB_00197911;
  case ot_destroyed:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_01,"attempted to unparse a QPDFObjectHandle from a destroyed QPDF");
LAB_00197911:
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_reference:
    QPDFObjGen::unparse_abi_cxx11_
              (&local_d8,
               &((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og,
               ' ');
    std::operator+(__return_storage_ptr__,&local_d8," R");
LAB_0019755c:
    std::__cxx11::string::~string((string *)&local_d8);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
BaseHandle::unparse() const
{
    switch (resolved_type_code()) {
    case ::ot_uninitialized:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse an uninitialized object");
        return ""; // does not return
    case ::ot_reserved:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse a reserved object");
        return ""; // does not return
    case ::ot_null:
        return "null";
    case ::ot_boolean:
        return std::get<QPDF_Bool>(obj->value).val ? "true" : "false";
    case ::ot_integer:
        return std::to_string(std::get<QPDF_Integer>(obj->value).val);
    case ::ot_real:
        return std::get<QPDF_Real>(obj->value).val;
    case ::ot_string:
        return std::get<QPDF_String>(obj->value).unparse(false);
    case ::ot_name:
        return Name::normalize(std::get<QPDF_Name>(obj->value).name);
    case ::ot_array:
        {
            auto const& a = std::get<QPDF_Array>(obj->value);
            std::string result = "[ ";
            if (a.sp) {
                int next = 0;
                for (auto& item: a.sp->elements) {
                    int key = item.first;
                    for (int j = next; j < key; ++j) {
                        result += "null ";
                    }
                    result += item.second.unparse() + " ";
                    next = ++key;
                }
                for (int j = next; j < a.sp->size; ++j) {
                    result += "null ";
                }
            } else {
                for (auto const& item: a.elements) {
                    result += item.unparse() + " ";
                }
            }
            result += "]";
            return result;
        }
    case ::ot_dictionary:
        {
            auto const& items = std::get<QPDF_Dictionary>(obj->value).items;
            std::string result = "<< ";
            for (auto& iter: items) {
                if (!iter.second.null()) {
                    result += Name::normalize(iter.first) + " " + iter.second.unparse() + " ";
                }
            }
            result += ">>";
            return result;
        }
    case ::ot_stream:
        return obj->og.unparse(' ') + " R";
    case ::ot_operator:
        return std::get<QPDF_Operator>(obj->value).val;
    case ::ot_inlineimage:
        return std::get<QPDF_InlineImage>(obj->value).val;
    case ::ot_unresolved:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse a unresolved object");
        return ""; // does not return
    case ::ot_destroyed:
        throw std::logic_error("attempted to unparse a QPDFObjectHandle from a destroyed QPDF");
        return ""; // does not return
    case ::ot_reference:
        return obj->og.unparse(' ') + " R";
    }
    return {}; // unreachable
}